

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStoreTestCase.cpp
# Opt level: O2

void __thiscall
resetBeforeAndAfterWithTestFileManager::resetBeforeAndAfterWithTestFileManager
          (resetBeforeAndAfterWithTestFileManager *this)

{
  FileStore *pFVar1;
  SessionID sessionID;
  allocator<char> local_314;
  allocator<char> local_313;
  allocator<char> local_312;
  allocator<char> local_311;
  string local_310 [32];
  string local_2f0;
  STRING local_2d0;
  STRING local_2b0;
  STRING local_290;
  FieldBase local_270;
  FieldBase local_218;
  FieldBase local_1c0;
  SessionID local_168;
  
  resetBeforeAndAfterFileStoreFixture::resetBeforeAndAfterFileStoreFixture
            (&this->super_resetBeforeAndAfterFileStoreFixture);
  FIX::FileStoreFactory::destroy((MessageStore *)this);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_290,"FIX.4.2",&local_311);
  FIX::BeginString::BeginString((BeginString *)&local_270,&local_290);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b0,"SETGET",&local_312);
  FIX::SenderCompID::SenderCompID((SenderCompID *)&local_218,&local_2b0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d0,"TEST",&local_313);
  FIX::TargetCompID::TargetCompID((TargetCompID *)&local_1c0,&local_2d0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f0,"Test",&local_314);
  FIX::SessionID::SessionID
            (&local_168,&local_270.m_string,&local_218.m_string,&local_1c0.m_string,&local_2f0);
  std::__cxx11::string::~string((string *)&local_2f0);
  FIX::FieldBase::~FieldBase(&local_1c0);
  std::__cxx11::string::~string((string *)&local_2d0);
  FIX::FieldBase::~FieldBase(&local_218);
  std::__cxx11::string::~string((string *)&local_2b0);
  FIX::FieldBase::~FieldBase(&local_270);
  std::__cxx11::string::~string((string *)&local_290);
  pFVar1 = (FileStore *)operator_new(0x138);
  FIX::UtcTimeStamp::now();
  std::__cxx11::string::string<std::allocator<char>>
            (local_310,"store",(allocator<char> *)&local_218);
  FIX::FileStore::FileStore(pFVar1,&local_270,local_310,&local_168);
  (this->super_resetBeforeAndAfterFileStoreFixture).super_fileStoreFixture.object =
       (MessageStore *)pFVar1;
  std::__cxx11::string::~string(local_310);
  FIX::SessionID::~SessionID(&local_168);
  return;
}

Assistant:

resetBeforeAndAfterWithTestFileManager()
      : resetBeforeAndAfterFileStoreFixture() {
    factory.destroy(object);

    SessionID sessionID(BeginString("FIX.4.2"), SenderCompID("SETGET"), TargetCompID("TEST"), "Test");

    object = new FileStore(UtcTimeStamp::now(), "store", sessionID);
  }